

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O1

MPP_RET jpege_proc_hal(void *ctx,HalEncTask *task)

{
  MppFrame s;
  long lVar1;
  RK_U32 RVar2;
  uint uVar3;
  uint uVar4;
  RockchipSocType RVar5;
  uint uVar6;
  undefined4 uVar7;
  
  s = task->frame;
  lVar1 = *ctx;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","enter ctx %p\n","jpege_proc_hal",ctx);
  }
  *(undefined4 *)((long)ctx + 8) = *(undefined4 *)(lVar1 + 0xc);
  *(undefined4 *)((long)ctx + 0xc) = *(undefined4 *)(lVar1 + 0x10);
  *(undefined4 *)((long)ctx + 0x10) = *(undefined4 *)(lVar1 + 0x14);
  *(undefined4 *)((long)ctx + 0x14) = *(undefined4 *)(lVar1 + 0x18);
  *(undefined4 *)((long)ctx + 0x2c) = *(undefined4 *)(lVar1 + 0x24);
  *(undefined4 *)((long)ctx + 0x30) = *(undefined4 *)(lVar1 + 0x38);
  *(undefined4 *)((long)ctx + 0x34) = *(undefined4 *)(lVar1 + 0x28);
  *(undefined4 *)((long)ctx + 0x38) = *(undefined4 *)(lVar1 + 0x50);
  *(undefined4 *)((long)ctx + 0x3c) = *(undefined4 *)(lVar1 + 0x58);
  RVar2 = mpp_frame_get_offset_x(s);
  *(RK_U32 *)((long)ctx + 0x40) = RVar2;
  RVar2 = mpp_frame_get_offset_y(s);
  *(RK_U32 *)((long)ctx + 0x44) = RVar2;
  *(undefined4 *)((long)ctx + 0x48) = *(undefined4 *)(lVar1 + 0x34c);
  *(undefined4 *)((long)ctx + 0x4c) = *(undefined4 *)(lVar1 + 0x350);
  *(undefined4 *)((long)ctx + 0x50) = *(undefined4 *)(lVar1 + 0x358);
  *(undefined4 *)((long)ctx + 0x54) = *(undefined4 *)(lVar1 + 0x354);
  *(undefined8 *)((long)ctx + 0x58) = *(undefined8 *)(lVar1 + 0x360);
  *(undefined8 *)((long)ctx + 0x60) = *(undefined8 *)(lVar1 + 0x368);
  *(undefined4 *)((long)ctx + 0xa8) = 0;
  *(undefined8 *)((long)ctx + 0xa0) = 0;
  if (((byte)jpege_debug & 0x10) != 0) {
    _mpp_log_l(4,"jpege_api_v2","Chroma format %d\n",(char *)0x0,(ulong)*(uint *)((long)ctx + 0x30))
    ;
  }
  if (*(int *)((long)ctx + 0x30) == 0) {
    *(undefined4 *)((long)ctx + 0x30) = 4;
  }
  *(undefined4 *)((long)ctx + 0xb8) = 0;
  *(undefined8 *)((long)ctx + 0xb0) = 0;
  switch(*(undefined4 *)((long)ctx + 0x30)) {
  case 1:
    *(undefined8 *)((long)ctx + 0xac) = 0x1010100000001;
    goto LAB_001c9755;
  default:
    *(undefined8 *)((long)ctx + 0xac) = 0x1010100000001;
    _mpp_log_l(2,"jpege_api_v2","Unsupported chroma format %d\n",(char *)0x0);
    goto LAB_001c9755;
  case 4:
    uVar7 = 0x20201;
    break;
  case 5:
    uVar7 = 0x10201;
    break;
  case 7:
    uVar7 = 0x10101;
  }
  *(undefined4 *)((long)ctx + 0xac) = 3;
  *(undefined4 *)((long)ctx + 0xb0) = uVar7;
  *(undefined4 *)((long)ctx + 0xb4) = 0x1010102;
  *(undefined4 *)((long)ctx + 0xb8) = 0x1010103;
LAB_001c9755:
  uVar3 = *(uint *)((long)ctx + 0xb0) >> 8 & 0xff;
  uVar4 = uVar3 * 8;
  *(uint *)((long)ctx + 0x24) = uVar4;
  uVar6 = *(uint *)((long)ctx + 0xb0) >> 0xd & 0x7f8;
  *(uint *)((long)ctx + 0x28) = uVar6;
  uVar4 = ((*(int *)((long)ctx + 8) + uVar3 * 8) - 1) / uVar4;
  *(uint *)((long)ctx + 0x18) = uVar4;
  uVar6 = ((uVar6 + *(int *)((long)ctx + 0xc)) - 1) / uVar6;
  *(uint *)((long)ctx + 0x1c) = uVar6;
  *(uint *)((long)ctx + 0x20) = uVar6 * uVar4;
  if (*(int *)(lVar1 + 0xe94) != 0) {
    if (*(int *)(lVar1 + 0xe94) == 2) {
      uVar4 = *(uint *)(lVar1 + 0xe98);
      if ((uVar4 == 0) || (*(uint *)((long)ctx + 0x20) < uVar4)) {
        _mpp_log_l(2,"jpege_api_v2","warning: invalid split arg %d > max %d\n","jpege_proc_hal",
                   (ulong)uVar4,(ulong)*(uint *)((long)ctx + 0x20));
        uVar4 = 0;
      }
      else {
        uVar3 = ((*(uint *)((long)ctx + 0x18) + uVar4) - 1) / *(uint *)((long)ctx + 0x18);
        uVar4 = 0;
        if (uVar3 < *(uint *)((long)ctx + 0x1c)) {
          uVar4 = uVar3;
        }
      }
    }
    else {
      uVar4 = 0;
      _mpp_log_l(2,"jpege_api_v2","warning: only mcu split is supported\n","jpege_proc_hal");
    }
    if (uVar4 != 0) {
      *(uint *)((long)ctx + 0xa4) = uVar4;
      RVar5 = mpp_get_soc_type();
      if ((RVar5 != ROCKCHIP_SOC_RK3576) ||
         (uVar3 = *(uint *)(lVar1 + 0xe98), *(uint *)((long)ctx + 0x20) < uVar3)) {
        uVar3 = uVar4 * *(int *)((long)ctx + 0x18);
      }
      *(uint *)((long)ctx + 0xa8) = uVar3;
      *(uint *)((long)ctx + 0xa0) = (uint)(*(int *)(lVar1 + 4) != 0);
      if (((byte)jpege_debug & 1) != 0) {
        _mpp_log_l(4,"jpege_api_v2","Split by CTU, part_rows %d, restart_ri %d","jpege_proc_hal",
                   (ulong)*(uint *)((long)ctx + 0xa4));
      }
    }
  }
  task->valid = 1;
  (task->syntax).data = (void *)((long)ctx + 8);
  (task->syntax).number = 1;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","leave ctx %p\n","jpege_proc_hal",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_proc_hal(void *ctx, HalEncTask *task)
{
    JpegeCtx *p = (JpegeCtx *)ctx;
    MppFrame frame = task->frame;
    JpegeSyntax *syntax = &p->syntax;
    MppEncCfgSet *cfg = p->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncCodecCfg *codec = &cfg->codec;
    MppEncSliceSplit *split = &cfg->split;

    jpege_dbg_func("enter ctx %p\n", ctx);

    syntax->width       = prep->width;
    syntax->height      = prep->height;
    syntax->hor_stride  = prep->hor_stride;
    syntax->ver_stride  = prep->ver_stride;
    syntax->format      = prep->format;
    syntax->format_out  = prep->format_out;
    syntax->color       = prep->color;
    syntax->rotation    = prep->rotation;
    syntax->mirroring   = prep->mirroring;
    syntax->offset_x    = mpp_frame_get_offset_x(frame);
    syntax->offset_y    = mpp_frame_get_offset_y(frame);
    syntax->quality     = codec->jpeg.quant;
    syntax->q_factor    = codec->jpeg.q_factor;
    syntax->qf_min      = codec->jpeg.qf_min;
    syntax->qf_max      = codec->jpeg.qf_max;
    syntax->qtable_y    = codec->jpeg.qtable_y;
    syntax->qtable_c    = codec->jpeg.qtable_u;
    syntax->part_rows   = 0;
    syntax->restart_ri  = 0;
    syntax->low_delay   = 0;

    init_jpeg_component_info(syntax);

    if (split->split_mode) {
        RK_U32 mb_w = syntax->mcu_hor_cnt;
        RK_U32 mb_h = syntax->mcu_ver_cnt;
        RK_U32 part_rows = 0;

        if (split->split_mode == MPP_ENC_SPLIT_BY_CTU) {
            RK_U32 part_mbs = split->split_arg;

            if (part_mbs > 0 && part_mbs <= syntax->mcu_cnt) {
                part_rows = (part_mbs + mb_w - 1) / mb_w;
                if (part_rows >= mb_h)
                    part_rows = 0;
            } else {
                mpp_err_f("warning: invalid split arg %d > max %d\n",
                          part_mbs, syntax->mcu_cnt);
            }
        } else {
            mpp_err_f("warning: only mcu split is supported\n");
        }

        if (part_rows) {
            syntax->part_rows   = part_rows;
            if (mpp_get_soc_type() == ROCKCHIP_SOC_RK3576 && split->split_arg <= syntax->mcu_cnt)
                syntax->restart_ri = split->split_arg;
            else
                syntax->restart_ri  = syntax->mcu_hor_cnt * part_rows;
            syntax->low_delay   = cfg->base.low_delay && part_rows;
            jpege_dbg_func("Split by CTU, part_rows %d, restart_ri %d",
                           syntax->part_rows, syntax->restart_ri);
        }
    }

    task->valid = 1;
    task->syntax.data = syntax;
    task->syntax.number = 1;

    jpege_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}